

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_tables.cpp
# Opt level: O0

u16 __thiscall YAJLHuffmanTable::HFTree::decode(HFTree *this,bitio_stream *bstream)

{
  uint64_t uVar1;
  ssize_t sVar2;
  uint8_t uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  bool bVar4;
  bool msb;
  uint64_t pkval;
  HFNode *curr;
  bitio_stream *bstream_local;
  HFTree *this_local;
  uint64_t __nbytes;
  
  pkval = (uint64_t)this->root;
  while( true ) {
    bVar4 = false;
    if (*(long *)pkval != 0) {
      bVar4 = *(long *)(pkval + 8) != 0;
    }
    if (!bVar4) break;
    __nbytes = pkval;
    uVar1 = bitio::bitio_stream::peek(bstream,'\b');
    __buf = extraout_RDX;
    if ((uVar1 == 0xff) &&
       (uVar1 = bitio::bitio_stream::peek(bstream,'\x10'), __buf = extraout_RDX_00, uVar1 == 0xff00)
       ) {
      this->count_bstuff = true;
      this->bstuff_count = '\0';
    }
    if ((this->count_bstuff & 1U) != 0) {
      uVar3 = this->bstuff_count + '\x01';
      __nbytes = CONCAT71((int7)(__nbytes >> 8),uVar3);
      this->bstuff_count = uVar3;
    }
    if (this->bstuff_count == '\b') {
      this->bstuff_count = '\0';
      this->count_bstuff = false;
      bitio::bitio_stream::skip(bstream,8);
      __buf = extraout_RDX_01;
    }
    sVar2 = bitio::bitio_stream::read(bstream,1,__buf,__nbytes);
    if (sVar2 == 0) {
      pkval = *(uint64_t *)pkval;
    }
    else {
      pkval = *(uint64_t *)(pkval + 8);
    }
  }
  return (u16)*(byte *)(pkval + 0x10);
}

Assistant:

u16 YAJLHuffmanTable::HFTree::decode(bitio::bitio_stream *bstream) {
    auto *curr = root;
    while (curr->left != nullptr && curr->right != nullptr) {
        if (bstream->peek(0x8) == 0xFF) {
            auto pkval = bstream->peek(0x10);
            if (pkval == 0xFF00) {
                count_bstuff = true;
                bstuff_count = 0;
            }
        }

        if (count_bstuff) {
            bstuff_count++;
        }
        if (bstuff_count == 8) {
            bstuff_count = 0;
            count_bstuff = false;
            bstream->skip(0x8);
        }

        bool msb = bstream->read(0x1);
        if (msb) {
            curr = curr->right;
        } else {
            curr = curr->left;
        }
    }
    return curr->symbol;
}